

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peak_event.c
# Opt level: O0

void duckdb_je_peak_event_update(tsd_t *tsd)

{
  long in_RDI;
  peak_t *peak;
  uint64_t dalloc;
  uint64_t alloc;
  uint8_t state_2;
  uint8_t state;
  uint8_t state_1;
  
  peak_update((peak_t *)(in_RDI + 0xe0),*(uint64_t *)(in_RDI + 0x340),*(uint64_t *)(in_RDI + 0x350))
  ;
  return;
}

Assistant:

void
peak_event_update(tsd_t *tsd) {
	uint64_t alloc = tsd_thread_allocated_get(tsd);
	uint64_t dalloc = tsd_thread_deallocated_get(tsd);
	peak_t *peak = tsd_peakp_get(tsd);
	peak_update(peak, alloc, dalloc);
}